

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jumptable.cc
# Opt level: O2

void __thiscall EmulateFunction::executeLoad(EmulateFunction *this)

{
  PcodeOp *pPVar1;
  int iVar2;
  undefined4 extraout_var;
  LoadTable local_20;
  
  if (this->collectloads == true) {
    iVar2 = (*(this->super_EmulatePcodeOp).super_Emulate._vptr_Emulate[0x16])
                      (this,(((this->super_EmulatePcodeOp).currentOp)->inrefs).
                            super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                            super__Vector_impl_data._M_start[1]);
    pPVar1 = (this->super_EmulatePcodeOp).currentOp;
    local_20.addr.base =
         (AddrSpace *)
         ((*(pPVar1->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
            super__Vector_impl_data._M_start)->loc).offset;
    local_20.addr.offset = (ulong)(local_20.addr.base)->wordsize * CONCAT44(extraout_var,iVar2);
    local_20.size = pPVar1->output->size;
    local_20.num = 1;
    std::vector<LoadTable,_std::allocator<LoadTable>_>::emplace_back<LoadTable>
              (&this->loadpoints,&local_20);
  }
  EmulatePcodeOp::executeLoad(&this->super_EmulatePcodeOp);
  return;
}

Assistant:

void EmulateFunction::executeLoad(void)

{
  if (collectloads) {
    uintb off = getVarnodeValue(currentOp->getIn(1));
    AddrSpace *spc = Address::getSpaceFromConst(currentOp->getIn(0)->getAddr());
    off = AddrSpace::addressToByte(off,spc->getWordSize());
    int4 sz = currentOp->getOut()->getSize();
    loadpoints.push_back(LoadTable(Address(spc,off),sz));
  }
  EmulatePcodeOp::executeLoad();
}